

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::INVALID_VARIABLE(Value *value,cmJSONState *state)

{
  undefined8 this;
  cmJSONState *in_RDX;
  string local_58;
  undefined1 local_38 [8];
  string var;
  cmJSONState *state_local;
  Value *value_local;
  
  var.field_2._8_8_ = state;
  getVariableName_abi_cxx11_((string *)local_38,(cmCMakePresetsErrors *)state,in_RDX);
  this = var.field_2._8_8_;
  cmStrCat<char_const(&)[15],std::__cxx11::string&>
            (&local_58,(char (*) [15])"Invalid CMake ",(string *)local_38);
  cmJSONState::AddErrorAtValue((cmJSONState *)this,&local_58,value);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void INVALID_VARIABLE(const Json::Value* value, cmJSONState* state)
{
  std::string var = cmCMakePresetsErrors::getVariableName(state);
  state->AddErrorAtValue(cmStrCat("Invalid CMake ", var), value);
}